

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 col;
  ImU32 col_00;
  undefined7 extraout_var;
  float *pfVar7;
  ImGuiCol idx;
  uint uVar8;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  float fVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  undefined1 auVar16 [12];
  int iVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  bool held;
  bool hovered;
  ImGuiAxis local_f0;
  float local_ec;
  ImRect local_e8;
  ImDrawCornerFlags local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  ulong local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar20 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar21 = (bb_frame->Max).y - (bb_frame->Min).y;
    held = false;
    if ((0.0 < fVar20) && (0.0 < fVar21)) {
      local_ec = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar9 = (GImGui->Style).FramePadding.y;
        fVar9 = fVar9 + fVar9;
        if (fVar21 < fVar9 + GImGui->FontSize) {
          fVar9 = (fVar21 - GImGui->FontSize) / fVar9;
          if (fVar9 < 0.0) {
            return false;
          }
          local_ec = 1.0;
          if (fVar9 <= 1.0) {
            local_ec = fVar9;
          }
          if (local_ec <= 0.0) {
            return false;
          }
        }
      }
      iVar15 = (int)((fVar20 + -2.0) * 0.5);
      iVar19 = (int)((fVar21 + -2.0) * 0.5);
      auVar13._0_4_ = -(uint)(iVar15 < 0);
      auVar13._4_4_ = -(uint)(iVar19 < 0);
      auVar13._8_8_ = 0;
      auVar17._0_4_ = -(uint)(3 < iVar15);
      auVar17._4_4_ = -(uint)(3 < iVar19);
      auVar17._8_8_ = 0;
      auVar14._0_8_ = CONCAT44((float)iVar19,(float)iVar15) ^ 0x8000000080000000;
      auVar14._8_4_ = 0x80000000;
      auVar14._12_4_ = 0x80000000;
      auVar14 = auVar13 & _DAT_002107a0 | ~auVar13 & (auVar17 & _DAT_00210790 | ~auVar17 & auVar14);
      fStack_b0 = auVar14._0_4_;
      fVar20 = auVar14._4_4_;
      auVar11._0_8_ = auVar14._0_8_;
      auVar11._8_4_ = fStack_b0;
      auVar11._12_4_ = fVar20;
      local_e8.Min.x = (bb_frame->Min).x;
      local_e8.Min.y = (bb_frame->Min).y;
      local_e8.Max.x = (bb_frame->Max).x;
      local_e8.Max.y = (bb_frame->Max).y;
      local_b8 = local_e8.Min.x - fStack_b0;
      fVar21 = local_e8.Min.y - fVar20;
      fStack_b0 = local_e8.Max.x + fStack_b0;
      fStack_b4 = local_e8.Max.y + fVar20;
      auVar4._4_8_ = auVar11._8_8_;
      auVar4._0_4_ = local_e8.Min.y + fVar20;
      auVar12._0_8_ = auVar4._0_8_ << 0x20;
      auVar12._8_4_ = fStack_b0;
      auVar12._12_4_ = fStack_b4;
      local_e8.Max = auVar12._8_8_;
      local_e8.Min.y = fVar21;
      local_e8.Min.x = local_b8;
      if (axis != ImGuiAxis_X) {
        fStack_b0 = fStack_b4;
        local_b8 = fVar21;
      }
      local_b8 = fStack_b0 - local_b8;
      fVar20 = (float)(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v |
                      -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v);
      local_c8 = CONCAT44(in_XMM1_Db,size_contents_v);
      local_cc = rounding_corners;
      if (fVar20 <= 0.0) {
        __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                      ,0x38b,
                      "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                     );
      }
      if (fVar20 <= 1.0) {
        fVar20 = 1.0;
      }
      fVar9 = (size_avail_v / fVar20) * local_b8;
      fVar20 = (GImGui->Style).GrabMinSize;
      fVar21 = local_b8;
      if (fVar9 <= local_b8) {
        fVar21 = fVar9;
      }
      uVar8 = -(uint)(fVar9 < fVar20);
      uStack_84 = ~in_XMM0_Db & (uint)fStack_b4;
      uStack_80 = ~in_XMM0_Dc & (uint)fStack_b0;
      uStack_7c = ~in_XMM0_Dd & (uint)fStack_b4;
      local_88 = (float)(uVar8 & (uint)fVar20 | ~uVar8 & (uint)fVar21);
      held = false;
      hovered = false;
      local_98 = (ImVec2 *)CONCAT44(in_XMM0_Db,size_avail_v);
      fStack_ac = fStack_b4;
      bVar6 = ButtonBehavior(&local_e8,id,&hovered,&held,0x4000);
      fVar20 = 1.0;
      if (1.0 <= (float)local_c8 - (float)local_98) {
        fVar20 = (float)local_c8 - (float)local_98;
      }
      auVar18._4_4_ = *p_scroll_v;
      auVar18._0_4_ = local_88;
      auVar18._8_4_ = uStack_84;
      auVar18._12_4_ = 0;
      auVar2._4_4_ = fVar20;
      auVar2._0_4_ = local_b8;
      auVar2._8_4_ = fStack_b4;
      auVar2._12_4_ = 0;
      auVar14 = divps(auVar18,auVar2);
      fVar9 = auVar14._4_4_;
      iVar15 = -(uint)(auVar14._0_4_ < 1.0);
      auVar3._4_4_ = iVar15;
      auVar3._0_4_ = iVar15;
      auVar3._8_4_ = -(uint)(fVar9 < 0.0);
      auVar3._12_4_ = -(uint)(fVar9 < 0.0);
      uVar8 = movmskpd((int)CONCAT71(extraout_var,bVar6),auVar3);
      fVar21 = 0.0;
      if (((uVar8 & 2) == 0) && (fVar21 = 1.0, fVar9 <= 1.0)) {
        fVar21 = fVar9;
      }
      local_98 = &bb_frame->Max;
      local_c8 = (ulong)(uint)((fVar21 * (local_b8 - local_88)) / local_b8);
      uStack_c0 = 0;
      if (((1.0 <= local_ec) && ((uVar8 & 1) != 0)) && (held != false)) {
        fStack_74 = fStack_b4;
        fStack_70 = fStack_b0;
        fStack_6c = fStack_ac;
        local_68 = (ulong)(uint)fVar20;
        uStack_60 = 0;
        local_f0 = axis;
        local_78 = local_b8 - local_88;
        local_58 = auVar14;
        pfVar7 = ImVec2::operator[](&local_e8.Min,(long)axis);
        local_a8._0_4_ = *pfVar7;
        pfVar7 = ImVec2::operator[](&(pIVar5->IO).MousePos,(long)axis);
        fVar21 = (*pfVar7 - (float)local_a8._0_4_) / local_b8;
        fVar20 = 1.0;
        if (fVar21 <= 1.0) {
          fVar20 = fVar21;
        }
        local_a8 = ZEXT416(~-(uint)(fVar21 < 0.0) & (uint)fVar20);
        SetHoveredID(id);
        if (pIVar5->ActiveIdIsJustActivated == false) {
          fVar20 = pIVar5->ScrollbarClickDeltaToGrabCenter;
          bVar6 = false;
        }
        else if (((float)local_a8._0_4_ < (float)local_c8) ||
                ((float)local_58._0_4_ + (float)local_c8 < (float)local_a8._0_4_)) {
          pIVar5->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar6 = true;
          fVar20 = 0.0;
        }
        else {
          fVar20 = (float)local_58._0_4_ * -0.5 + ((float)local_a8._0_4_ - (float)local_c8);
          pIVar5->ScrollbarClickDeltaToGrabCenter = fVar20;
          bVar6 = false;
        }
        auVar16 = ZEXT812(0x3f800000);
        fVar20 = (((float)local_a8._0_4_ - fVar20) - (float)local_58._0_4_ * 0.5) /
                 (1.0 - (float)local_58._0_4_);
        auVar10 = ZEXT812(0x3f800000);
        if (fVar20 <= 1.0) {
          auVar10._4_8_ = auVar10._4_8_;
          auVar10._0_4_ = fVar20;
        }
        fVar20 = (float)(int)((float)(~-(uint)(fVar20 < 0.0) & auVar10._0_4_) * (float)local_68 +
                             0.5);
        *p_scroll_v = fVar20;
        fVar20 = fVar20 / (float)local_68;
        if (fVar20 <= auVar16._0_4_) {
          auVar16._4_8_ = auVar16._4_8_;
          auVar16._0_4_ = fVar20;
        }
        fVar20 = (local_78 * (float)(~-(uint)(fVar20 < 0.0) & auVar16._0_4_)) / local_b8;
        local_c8 = CONCAT44(fStack_74,fVar20);
        uStack_c0 = CONCAT44(fStack_6c,fStack_70);
        axis = local_f0;
        if (bVar6) {
          pIVar5->ScrollbarClickDeltaToGrabCenter =
               -(float)local_58._0_4_ * 0.5 + ((float)local_a8._0_4_ - fVar20);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (held == false) {
        idx = (hovered & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_ec);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,local_98,col,pIVar1->WindowRounding,local_cc);
      if (axis == ImGuiAxis_X) {
        local_40.x = local_e8.Min.x + (local_e8.Max.x - local_e8.Min.x) * (float)local_c8;
        local_38.x = local_88 + local_40.x;
        local_40.y = local_e8.Min.y;
        local_38.y = local_e8.Max.y;
      }
      else {
        local_40.y = (local_e8.Max.y - local_e8.Min.y) * (float)local_c8 + local_e8.Min.y;
        local_40.x = local_e8.Min.x;
        local_38.x = local_e8.Max.x;
        local_38.y = local_88 + local_40.y;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_40,&local_38,col_00,(pIVar5->Style).ScrollbarRounding,0xf);
    }
  }
  else {
    held = false;
  }
  return held;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}